

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signalhandler.cc
# Opt level: O3

void google::anon_unknown_0::DumpStackFrameInfo(char *prefix,void *pc)

{
  char *pcVar1;
  char *__dest;
  char *__src;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  byte bVar4;
  byte bVar5;
  bool bVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  char *pcVar10;
  uint uVar11;
  long lVar12;
  char *pcVar13;
  char cVar14;
  uint extraout_EDX;
  ptrdiff_t _Num;
  char **ppcVar15;
  char **ppcVar16;
  char **ppcVar17;
  char *pcVar18;
  size_t __len;
  size_t __n;
  char acStack_89e [38];
  code *pcStack_878;
  char *pcStack_870;
  char *pcStack_868;
  undefined1 *puStack_860;
  char local_858 [8];
  char symbolized [1024];
  char buf [1024];
  char *local_40;
  char *local_38;
  
  puStack_860 = (undefined1 *)0x120e2d;
  bVar6 = Symbolize((void *)((long)pc + -1),local_858,0x400);
  buf._1016_8_ = symbolized + 0x3f8;
  pcVar10 = buf + 0x3f8;
  pcVar18 = "(unknown)";
  if (bVar6) {
    pcVar18 = local_858;
  }
  cVar14 = *prefix;
  if (cVar14 == '\0') {
    uVar8 = 0;
    symbolized[0x3f8] = '@';
LAB_00120e95:
    lVar9 = 2;
    symbolized[uVar8 + 0x3f9] = ' ';
  }
  else {
    lVar9 = 0;
    uVar8 = 0;
    do {
      uVar7 = uVar8;
      if (uVar7 == 0x400) {
        uVar8 = 0x400;
        goto LAB_00120ea9;
      }
      symbolized[uVar7 + 0x3f8] = cVar14;
      cVar14 = prefix[uVar7 + 1];
      uVar8 = uVar7 + 1;
    } while (cVar14 != '\0');
    if (uVar7 < 0x3ff) {
      symbolized[uVar7 + 0x3f9] = '@';
      if (uVar8 != 0x3ff) goto LAB_00120e95;
      lVar9 = 1;
      uVar8 = 0x3ff;
    }
    else {
      lVar9 = 0;
    }
  }
LAB_00120ea9:
  lVar9 = uVar8 + lVar9;
  __src = symbolized + lVar9 + 0x3f8;
  if (lVar9 < 0x400) {
    lVar12 = 1;
    symbolized[lVar9 + 0x3f8] = '0';
    if (lVar9 != 0x3ff) {
      lVar12 = 2;
      symbolized[lVar9 + 0x3f9] = 'x';
    }
  }
  else {
    lVar12 = 0;
  }
  pcVar13 = __src + lVar12;
  puStack_860 = (undefined1 *)0x120ef7;
  MinimalFormatter::AppendUint64((MinimalFormatter *)(buf + 0x3f8),(uint64)pc,0x10);
  pcVar1 = buf + lVar9 + 10;
  if (pcVar13 < pcVar1) {
    __n = (long)pcVar1 - (long)pcVar13;
    __dest = __src + __n;
    local_40 = __src;
    if (__src != pcVar13) {
      local_38 = pcVar13;
      if ((pcVar13 == (char *)0x0) || ((long)pcVar13 - (long)__src < 0)) goto LAB_00121002;
      puStack_860 = (undefined1 *)0x120f38;
      memmove(__dest,__src,(long)pcVar13 - (long)__src);
    }
    local_38 = __dest;
    if ((long)__n < 0) {
      puStack_860 = (undefined1 *)0x121002;
      local_40 = __src;
      _GLOBAL__N_1::DumpStackFrameInfo();
LAB_00121002:
      ppcVar16 = &local_40;
      ppcVar15 = &local_38;
      puStack_860 = (undefined1 *)0x12100f;
      _GLOBAL__N_1::DumpStackFrameInfo();
      ppcVar17 = (char **)CONCAT44(0,extraout_EDX);
      uVar11 = 0;
      do {
        pcStack_870 = ppcVar16[1];
        uVar8 = (ulong)uVar11;
        if (ppcVar16[2] <= pcStack_870 + uVar8) goto LAB_00121063;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = ppcVar17;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = ppcVar15;
        bVar5 = SUB161(auVar3 % auVar2,0);
        bVar4 = bVar5 + 0x57;
        if (SUB168(auVar3 % auVar2,0) < 10) {
          bVar4 = bVar5 | 0x30;
        }
        uVar11 = uVar11 + 1;
        pcStack_870[uVar8] = bVar4;
        bVar6 = ppcVar17 <= ppcVar15;
        ppcVar15 = (char **)((ulong)ppcVar15 / (ulong)ppcVar17);
      } while (bVar6);
      pcStack_870 = ppcVar16[1];
      uVar8 = (ulong)uVar11;
LAB_00121063:
      pcStack_868 = pcStack_870 + uVar8;
      if (pcStack_870 == (char *)0x0 && uVar11 != 0) {
        ppcVar16 = &pcStack_870;
        ppcVar15 = &pcStack_868;
        pcStack_878 = WriteToStderr;
        puStack_860 = &stack0xfffffffffffffff8;
        _GLOBAL__N_1::MinimalFormatter::AppendUint64();
        pcStack_878 = (code *)&puStack_860;
        write(2,ppcVar16,(size_t)ppcVar15);
        return;
      }
      if ((uVar11 != 0) && (pcStack_868 = pcStack_868 + -1, pcStack_870 < pcStack_868)) {
        do {
          pcVar10 = pcStack_870 + 1;
          cVar14 = *pcStack_870;
          *pcStack_870 = *pcStack_868;
          *pcStack_868 = cVar14;
          pcStack_868 = pcStack_868 + -1;
          pcStack_870 = pcVar10;
        } while (pcVar10 < pcStack_868);
        pcStack_870 = ppcVar16[1];
      }
      ppcVar16[1] = pcStack_870 + uVar8;
      return;
    }
    puStack_860 = (undefined1 *)0x120f59;
    local_40 = __src;
    memset(__src,0x20,__n);
    pcVar13 = pcVar1;
  }
  bVar6 = pcVar13 < pcVar10;
  if (bVar6) {
    *pcVar13 = ' ';
  }
  cVar14 = *pcVar18;
  for (lVar9 = 0; (cVar14 != '\0' && (pcVar13 + lVar9 + (ulong)bVar6 < pcVar10)); lVar9 = lVar9 + 1)
  {
    pcVar13[lVar9 + (ulong)bVar6] = cVar14;
    cVar14 = pcVar18[lVar9 + 1];
  }
  pcVar13 = pcVar13 + lVar9 + (ulong)bVar6;
  if (pcVar13 < pcVar10) {
    *pcVar13 = '\n';
  }
  puStack_860 = (undefined1 *)0x120fc0;
  (*(code *)(anonymous_namespace)::g_failure_writer)
            (symbolized + 0x3f8,pcVar13 + ((ulong)(pcVar13 < pcVar10) - buf._1016_8_));
  return;
}

Assistant:

void DumpStackFrameInfo(const char* prefix, void* pc) {
  // Get the symbol name.
  const char *symbol = "(unknown)";
  char symbolized[1024];  // Big enough for a sane symbol.
  // Symbolizes the previous address of pc because pc may be in the
  // next function.
  if (Symbolize(reinterpret_cast<char *>(pc) - 1,
                symbolized, sizeof(symbolized))) {
    symbol = symbolized;
  }

  char buf[1024];  // Big enough for stack frame info.
  MinimalFormatter formatter(buf, sizeof(buf));

  formatter.AppendString(prefix);
  formatter.AppendString("@ ");
  const int width = 2 * sizeof(void*) + 2;  // + 2  for "0x".
  formatter.AppendHexWithPadding(reinterpret_cast<uintptr_t>(pc), width);
  formatter.AppendString(" ");
  formatter.AppendString(symbol);
  formatter.AppendString("\n");
  g_failure_writer(buf, formatter.num_bytes_written());
}